

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_edges(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *pHVar2;
  DrawStyle *pDVar3;
  long lVar4;
  long lVar5;
  _List_node_base *p_Var6;
  
  pSVar1 = (this->super_SceneObject).scene;
  pHVar2 = (pSVar1->hovered).element;
  lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Edge::typeinfo,0);
  if (lVar4 == 0) goto LAB_0016d9d8;
  lVar4 = *(long *)(*(long *)(lVar4 + 0x58) + 0x30);
  if (pSVar1 == (Scene *)0x0) {
LAB_0016d978:
    lVar5 = 0x1d0;
  }
  else if ((pSVar1->selected).element == (HalfedgeElement *)(lVar4 + 0x10)) {
    lVar5 = 0x1e0;
  }
  else {
    if (pHVar2 != (HalfedgeElement *)(lVar4 + 0x10)) goto LAB_0016d978;
    lVar5 = 0x1d8;
  }
  lVar5 = *(long *)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar5);
  glColor4fv(lVar5 + 0x20);
  glLineWidth(*(undefined4 *)(lVar5 + 0x50));
  glBegin(1);
  glVertex3dv(*(long *)(*(long *)(lVar4 + 0x68) + 0x28) + 0x18);
  glVertex3dv(*(long *)(*(long *)(*(long *)(lVar4 + 0x68) + 0x18) + 0x28) + 0x18);
  glEnd();
LAB_0016d9d8:
  pDVar3 = this->defaultStyle;
  glColor4fv(&pDVar3->edgeColor);
  glLineWidth(pDVar3->strokeWidth);
  glBegin(1);
  for (p_Var6 = (this->mesh).edges.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var6 != (_List_node_base *)&(this->mesh).edges; p_Var6 = p_Var6->_M_next) {
    glVertex3dv(&p_Var6[6]._M_prev[2]._M_prev[1]._M_prev);
    glVertex3dv(&p_Var6[6]._M_prev[1]._M_prev[2]._M_prev[1]._M_prev);
  }
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_edges() const
{

   // Draw seleted edge
   Edge* ep = scene->hovered.element->getEdge();
   if( ep )
   {
      EdgeIter e = ep->halfedge()->edge();

      DrawStyle *style = get_draw_style(elementAddress(e));
      style->style_edge();

      glBegin(GL_LINES);
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
      glEnd();
   }

   // Draw all edges
   defaultStyle->style_edge();
   glBegin(GL_LINES);
   for( EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++ )
   {
      glVertex3dv(&e->halfedge()->vertex()->position.x);
      glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
   }
   glEnd();

   defaultStyle->style_reset();
}